

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol.cpp
# Opt level: O0

void EBMOL::ComputeAofs(MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,
                       MultiFab *umac,MultiFab *vmac,MultiFab *wmac,MultiFab *xedge,MultiFab *yedge,
                       MultiFab *zedge,int edge_comp,bool known_edgestate,MultiFab *xfluxes,
                       MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,MultiFab *divu,
                       Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
                       DeviceVector<int> *iconserv,Geometry *geom,Real dt,bool is_velocity,
                       string *redistribution_type)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FabType FVar5;
  FabFactory<amrex::FArrayBox> *pFVar6;
  MFItInfo *pMVar7;
  FabArrayBase *in_RCX;
  uint in_EDX;
  int in_ESI;
  FabArrayBase *in_RDI;
  int in_R8D;
  FabArrayBase *in_stack_00000018;
  FabArrayBase *in_stack_00000020;
  FabArrayBase *in_stack_00000028;
  int in_stack_00000030;
  byte in_stack_00000038;
  FabArrayBase *in_stack_00000040;
  FabArrayBase *in_stack_00000048;
  FabArrayBase *in_stack_00000050;
  int in_stack_00000058;
  anon_class_200_4_0a8c7edc *in_stack_00000070;
  PODVector<int,_std::allocator<int>_> *in_stack_00000078;
  MultiCutFab *in_stack_00000080;
  byte in_stack_00000088;
  string *in_stack_00000090;
  Array4<double> *advc_arr_1;
  Array4<double> scratch;
  Elixir eli;
  FArrayBox tmpfab;
  Box gbx;
  Array4<const_double> vfrac_1;
  Array4<const_double> ccc_1;
  Array4<const_double> fcz_1;
  Array4<const_double> fcy_1;
  Array4<const_double> fcx_1;
  Array4<const_double> apz_1;
  Array4<const_double> apy_1;
  Array4<const_double> apx_1;
  Box result_1;
  Array4<double> *aofs_arr_1;
  Array4<const_amrex::EBCellFlag> *flag_1;
  EBCellFlagFab *flagfab_1;
  Box *bx_1;
  MFIter mfi_1;
  Array4<const_double> *divu_arr_1;
  Array4<const_double> *q_2;
  Real mult_1;
  Array4<const_double> q_3;
  Array4<const_double> *divu_arr;
  Array4<const_double> *q;
  Real mult;
  Array4<const_double> q_1;
  Array4<const_double> vfrac;
  Array4<const_double> ccc;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_double> fcx;
  Box result;
  bool regular;
  Array4<double> advc_arr;
  Array4<const_double> w;
  Array4<const_double> v;
  Array4<const_double> u;
  Array4<double> *aofs_arr;
  Array4<const_amrex::EBCellFlag> *flag;
  EBCellFlagFab *flagfab;
  Array4<double> zed;
  Array4<double> yed;
  Array4<double> xed;
  Array4<double> fz;
  Array4<double> fy;
  Array4<double> fx;
  Box *zbx;
  Box *ybx;
  Box *xbx;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  Box *domain;
  MultiFab advc;
  EBFArrayBoxFactory *ebfactory;
  int halo;
  int *iconserv_ptr;
  bool fluxes_are_area_weighted;
  MultiCutFab *f2;
  MultiCutFab *in_stack_ffffffffffffe000;
  Array4<const_double> *pAVar8;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe008;
  undefined4 uVar9;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe010;
  MultiCutFab *in_stack_ffffffffffffe018;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe020;
  anon_class_200_4_0a8c7edc *paVar10;
  FabArrayBase *in_stack_ffffffffffffe028;
  MultiCutFab *in_stack_ffffffffffffe030;
  BoxArray *in_stack_ffffffffffffe038;
  anon_class_200_4_0a8c7edc *in_stack_ffffffffffffe040;
  MultiCutFab *in_stack_ffffffffffffe048;
  undefined4 uVar11;
  anon_class_200_4_0a8c7edc *in_stack_ffffffffffffe050;
  MFIter *in_stack_ffffffffffffe060;
  undefined8 in_stack_ffffffffffffe068;
  undefined4 in_stack_ffffffffffffe070;
  undefined4 in_stack_ffffffffffffe074;
  Box *in_stack_ffffffffffffe120;
  EBCellFlagFab *in_stack_ffffffffffffe128;
  undefined8 in_stack_ffffffffffffe158;
  Real in_stack_ffffffffffffe160;
  Array4<const_double> *in_stack_ffffffffffffe168;
  undefined4 in_stack_ffffffffffffe170;
  uint in_stack_ffffffffffffe174;
  Array4<const_double> *fy_00;
  Array4<const_double> *this;
  Array4<const_double> *this_00;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe198;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe1a0;
  Array4<const_double> *in_stack_ffffffffffffe1a8;
  Array4<const_double> *in_stack_ffffffffffffe1b0;
  Array4<const_double> *in_stack_ffffffffffffe1b8;
  Array4<const_double> *in_stack_ffffffffffffe1c0;
  undefined4 in_stack_ffffffffffffe1c8;
  uint in_stack_ffffffffffffe1cc;
  Geometry *in_stack_ffffffffffffe200;
  Geometry *in_stack_ffffffffffffe218;
  undefined8 in_stack_ffffffffffffe220;
  int line;
  char *in_stack_ffffffffffffe228;
  char *in_stack_ffffffffffffe230;
  undefined1 local_1d10 [64];
  undefined1 auStack_1cd0 [63];
  undefined1 in_stack_ffffffffffffe36f;
  Array4<const_double> *in_stack_ffffffffffffe370;
  Array4<const_double> *in_stack_ffffffffffffe378;
  Array4<double> *in_stack_ffffffffffffe380;
  Array4<double> *in_stack_ffffffffffffe388;
  Array4<double> *in_stack_ffffffffffffe390;
  Box *in_stack_ffffffffffffe398;
  undefined1 local_1c48 [64];
  undefined1 local_1c08 [224];
  undefined1 local_1b28 [23];
  undefined1 in_stack_ffffffffffffe4ef;
  Array4<const_double> *in_stack_ffffffffffffe4f0;
  Array4<const_double> *in_stack_ffffffffffffe4f8;
  Array4<double> *in_stack_ffffffffffffe500;
  Array4<double> *in_stack_ffffffffffffe508;
  Array4<double> *in_stack_ffffffffffffe510;
  Box *in_stack_ffffffffffffe518;
  Array4<double> local_1ac8;
  undefined1 local_1a70 [16];
  Array4<const_double> *in_stack_ffffffffffffe5a0;
  Array4<const_double> *in_stack_ffffffffffffe5a8;
  Array4<const_double> *in_stack_ffffffffffffe5b0;
  Array4<const_double> *in_stack_ffffffffffffe5b8;
  Geometry *in_stack_ffffffffffffe5c0;
  int in_stack_ffffffffffffe5c8;
  Box local_1a28 [3];
  undefined1 in_stack_ffffffffffffe633;
  int in_stack_ffffffffffffe634;
  Array4<const_double> *in_stack_ffffffffffffe638;
  Array4<double> *in_stack_ffffffffffffe640;
  Array4<double> *in_stack_ffffffffffffe648;
  Array4<double> *in_stack_ffffffffffffe650;
  Box *in_stack_ffffffffffffe658;
  EBCellFlagFab local_1980;
  Array4<const_double> *in_stack_ffffffffffffe720;
  Array4<const_double> *in_stack_ffffffffffffe728;
  Array4<const_double> *in_stack_ffffffffffffe730;
  Array4<const_double> *in_stack_ffffffffffffe738;
  Array4<const_double> *in_stack_ffffffffffffe740;
  Array4<const_double> *in_stack_ffffffffffffe748;
  Array4<const_double> *in_stack_ffffffffffffe750;
  Geometry *in_stack_ffffffffffffe758;
  int in_stack_ffffffffffffe760;
  Array4<const_amrex::EBCellFlag> *in_stack_ffffffffffffe768;
  Array4<const_double> *in_stack_ffffffffffffe7a0;
  Array4<const_double> *in_stack_ffffffffffffe7a8;
  undefined8 in_stack_ffffffffffffe7b0;
  undefined8 in_stack_ffffffffffffe7b8;
  undefined8 in_stack_ffffffffffffe7c0;
  undefined8 in_stack_ffffffffffffe7c8;
  undefined1 local_1808 [156];
  undefined1 local_176c [16];
  pointer local_175c;
  IndexType local_1754;
  Arena local_1750 [2];
  DataAllocator local_1710;
  undefined1 local_1708 [216];
  IntVect local_1630;
  Ref *local_1620;
  int local_1618;
  DataAllocator local_1610;
  undefined1 auStack_1608 [64];
  undefined1 auStack_15c8 [64];
  undefined1 auStack_1588 [64];
  undefined1 local_1548 [64];
  undefined1 *local_1508;
  Real in_stack_ffffffffffffeb28;
  Real in_stack_ffffffffffffeb30;
  Array4<double> *in_stack_ffffffffffffeb38;
  Array4<const_double> *in_stack_ffffffffffffeb40;
  Array4<double> *in_stack_ffffffffffffeb48;
  Array4<double> *in_stack_ffffffffffffeb50;
  int in_stack_ffffffffffffeb5c;
  Box *in_stack_ffffffffffffeb60;
  Array4<const_double> local_1478;
  Array4<const_double> local_1438;
  undefined8 local_13f8;
  undefined1 local_13f0 [128];
  Array4<const_double> local_1370;
  Array4<const_double> local_1330;
  Arena *local_12f0;
  undefined1 auStack_12e8 [64];
  undefined1 auStack_12a8 [64];
  undefined1 auStack_1268 [64];
  undefined1 local_1228 [64];
  undefined1 *local_11e8;
  undefined1 local_11e0 [64];
  undefined1 *local_11a0;
  Array4<const_double> local_1198;
  Array4<const_double> local_1158;
  Array4<const_double> local_1118;
  undefined8 local_10d8;
  Array4<const_double> local_1090;
  undefined1 in_stack_ffffffffffffefc3;
  int in_stack_ffffffffffffefc4;
  Array4<const_double> *in_stack_ffffffffffffefc8;
  Array4<double> *in_stack_ffffffffffffefd0;
  Array4<double> *in_stack_ffffffffffffefd8;
  Array4<double> *in_stack_ffffffffffffefe0;
  Box *in_stack_ffffffffffffefe8;
  Geometry local_1010;
  undefined8 in_stack_fffffffffffff130;
  undefined8 in_stack_fffffffffffff138;
  undefined8 in_stack_fffffffffffff140;
  undefined8 in_stack_fffffffffffff148;
  undefined8 in_stack_fffffffffffff150;
  undefined8 in_stack_fffffffffffff158;
  undefined8 in_stack_fffffffffffff160;
  undefined8 in_stack_fffffffffffff168;
  element_type *in_stack_fffffffffffff170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff178;
  Array4<const_double> *in_stack_fffffffffffff180;
  undefined8 in_stack_fffffffffffff188;
  pointer local_d40;
  Long local_d38;
  Long local_d30;
  IndexType local_d28;
  undefined1 local_d21;
  undefined1 local_d20 [64];
  undefined1 local_ce0 [192];
  undefined1 local_c20 [64];
  undefined1 auStack_be0 [64];
  undefined1 local_ba0 [64];
  undefined1 auStack_b60 [64];
  undefined1 local_b20 [64];
  undefined1 auStack_ae0 [64];
  undefined1 local_aa0 [48];
  MultiArray4<const_double> in_stack_fffffffffffff590;
  Array4<const_double> *in_stack_fffffffffffff598;
  Array4<const_double> *in_stack_fffffffffffff5a0;
  Array4<const_double> *in_stack_fffffffffffff5a8;
  Array4<const_double> *in_stack_fffffffffffff5b0;
  Array4<const_double> *in_stack_fffffffffffff5b8;
  Array4<const_double> *in_stack_fffffffffffff5c0;
  _Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false> in_stack_fffffffffffff5c8;
  _Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false> in_stack_fffffffffffff5d0;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> in_stack_fffffffffffff5d8;
  Geometry *in_stack_fffffffffffff5e0;
  string *in_stack_fffffffffffff5e8;
  int in_stack_fffffffffffff5f0;
  Array4<const_double> *in_stack_fffffffffffff5f8;
  Array4<double> local_9c8;
  Array4<double> local_988;
  Array4<double> local_948;
  Array4<double> local_908;
  Array4<double> local_8c8;
  Array4<double> local_888;
  undefined1 local_844 [28];
  undefined1 *local_828;
  undefined1 local_81c [108];
  Array4<const_double> *local_7b0;
  MFIter local_7a8;
  MFItInfo local_744;
  Box *local_730;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  MultiCutFab *local_568;
  int local_55c;
  Arena *local_558;
  byte local_54a;
  byte local_549;
  byte local_539;
  int local_52c;
  FabArrayBase *local_528;
  uint local_520;
  int local_51c;
  FabArrayBase *local_518;
  undefined8 local_510;
  undefined4 local_504;
  char *local_500;
  char *local_4f8;
  undefined8 local_4f0;
  undefined4 local_4e4;
  char *local_4e0;
  char *local_4d8;
  undefined8 local_4d0;
  undefined4 local_4c4;
  char *local_4c0;
  char *local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a4;
  char *local_4a0;
  char *local_498;
  undefined8 local_490;
  undefined4 local_484;
  char *local_480;
  char *local_478;
  undefined8 local_470;
  undefined4 local_464;
  char *local_460;
  char *local_458;
  undefined8 local_450;
  undefined4 local_444;
  char *local_440;
  char *local_438;
  undefined8 local_430;
  undefined4 local_424;
  char *local_420;
  char *local_418;
  undefined8 local_410;
  undefined4 local_404;
  char *local_400;
  char *local_3f8;
  undefined8 local_3f0;
  undefined4 local_3e4;
  char *local_3e0;
  char *local_3d8;
  undefined8 local_3d0;
  undefined4 local_3c4;
  char *local_3c0;
  char *local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a4;
  char *local_3a0;
  char *local_398;
  undefined8 local_390;
  undefined4 local_384;
  char *local_380;
  char *local_378;
  undefined8 local_370;
  undefined4 local_364;
  char *local_360;
  char *local_358;
  EBCellFlagFab *local_350;
  EBCellFlagFab *local_348;
  undefined4 local_33c;
  _Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false> local_338;
  int local_32c;
  Array4<const_double> *local_328;
  Array4<double> local_320;
  int local_2dc;
  undefined1 *local_2d8;
  Dim3 local_2d0;
  Dim3 local_2bc;
  Dim3 local_2b0;
  Dim3 local_2a0;
  int local_294;
  Box *local_290;
  EBCellFlag *local_288;
  Dim3 local_280;
  Dim3 local_26c;
  Dim3 local_260;
  Dim3 local_250;
  int local_244;
  Box *local_240;
  EBCellFlag *local_238;
  Dim3 local_230;
  Box *local_220;
  int local_218;
  int iStack_214;
  int local_210;
  undefined4 local_20c;
  Box *local_208;
  undefined4 local_1fc;
  Box *local_1f8;
  undefined4 local_1ec;
  Box *local_1e8;
  Dim3 local_1e0;
  Box *local_1d0;
  int local_1c8;
  int iStack_1c4;
  int local_1c0;
  undefined4 local_1bc;
  Box *local_1b8;
  undefined4 local_1ac;
  Box *local_1a8;
  undefined4 local_19c;
  Box *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  IntVect *local_168;
  undefined4 local_15c;
  IntVect *local_158;
  undefined4 local_14c;
  IntVect *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_e0 [2];
  int local_c8;
  Dim3 local_c0;
  int local_b4;
  undefined1 *local_b0;
  int local_98;
  undefined1 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined1 *local_78;
  undefined4 local_6c;
  undefined1 *local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  Dim3 local_50;
  undefined1 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  undefined1 *local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined4 local_c;
  undefined1 *local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffe220 >> 0x20);
  local_539 = in_stack_00000038 & 1;
  local_549 = in_stack_00000088 & 1;
  local_54a = 1;
  local_52c = in_R8D;
  local_528 = in_RCX;
  local_520 = in_EDX;
  local_51c = in_ESI;
  local_518 = in_RDI;
  local_558 = (Arena *)amrex::PODVector<int,_std::allocator<int>_>::data(in_stack_00000078);
  iVar3 = amrex::FabArrayBase::nComp(local_518);
  if (iVar3 < (int)(local_51c + local_520)) {
    local_358 = "aofs.nComp() >= aofs_comp + ncomp";
    local_360 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_364 = 0x30;
    local_370 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  iVar3 = amrex::FabArrayBase::nComp(local_528);
  if (iVar3 < (int)(local_52c + local_520)) {
    local_378 = "state.nComp() >= state_comp + ncomp";
    local_380 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_384 = 0x31;
    local_390 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  iVar3 = amrex::FabArrayBase::nComp(in_stack_00000018);
  if (iVar3 < (int)(in_stack_00000030 + local_520)) {
    local_398 = "xedge.nComp() >= edge_comp + ncomp";
    local_3a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_3a4 = 0x32;
    local_3b0 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  iVar3 = amrex::FabArrayBase::nComp(in_stack_00000020);
  if (iVar3 < (int)(in_stack_00000030 + local_520)) {
    local_3b8 = "yedge.nComp() >= edge_comp + ncomp";
    local_3c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_3c4 = 0x33;
    local_3d0 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  iVar3 = amrex::FabArrayBase::nComp(in_stack_00000028);
  if (iVar3 < (int)(in_stack_00000030 + local_520)) {
    local_3d8 = "zedge.nComp() >= edge_comp + ncomp";
    local_3e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_3e4 = 0x34;
    local_3f0 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  iVar3 = amrex::FabArrayBase::nComp(in_stack_00000040);
  if (iVar3 < (int)(in_stack_00000058 + local_520)) {
    local_3f8 = "xfluxes.nComp() >= fluxes_comp + ncomp";
    local_400 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_404 = 0x35;
    local_410 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  iVar3 = amrex::FabArrayBase::nComp(in_stack_00000048);
  if (iVar3 < (int)(in_stack_00000058 + local_520)) {
    local_418 = "yfluxes.nComp() >= fluxes_comp + ncomp";
    local_420 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_424 = 0x36;
    local_430 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  iVar3 = amrex::FabArrayBase::nComp(in_stack_00000050);
  if (iVar3 < (int)(in_stack_00000058 + local_520)) {
    local_438 = "zfluxes.nComp() >= fluxes_comp + ncomp";
    local_440 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_444 = 0x37;
    local_450 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  iVar3 = amrex::FabArrayBase::nGrow(local_518,0);
  if (iVar3 != 0) {
    local_458 = "aofs.nGrow() == 0";
    local_460 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_464 = 0x38;
    local_470 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  iVar3 = amrex::FabArrayBase::nGrow(in_stack_00000040,0);
  iVar4 = amrex::FabArrayBase::nGrow(in_stack_00000018,0);
  if (iVar3 != iVar4) {
    local_478 = "xfluxes.nGrow() == xedge.nGrow()";
    local_480 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_484 = 0x39;
    local_490 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  iVar3 = amrex::FabArrayBase::nGrow(in_stack_00000048,0);
  iVar4 = amrex::FabArrayBase::nGrow(in_stack_00000020,0);
  if (iVar3 != iVar4) {
    local_498 = "yfluxes.nGrow() == yedge.nGrow()";
    local_4a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_4a4 = 0x3a;
    local_4b0 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  iVar3 = amrex::FabArrayBase::nGrow(in_stack_00000050,0);
  iVar4 = amrex::FabArrayBase::nGrow(in_stack_00000028,0);
  if (iVar3 != iVar4) {
    local_4b8 = "zfluxes.nGrow() == zedge.nGrow()";
    local_4c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_4c4 = 0x3b;
    local_4d0 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  if (((local_539 & 1) == 0) && (iVar3 = amrex::FabArrayBase::nGrow(local_528,0), iVar3 < 2)) {
    local_4d8 = "state.nGrow() >= 2";
    local_4e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_4e4 = 0x3f;
    local_4f0 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  local_55c = 2;
  if ((local_539 & 1) != 0) {
    local_55c = 0;
  }
  bVar2 = amrex::FabArray<amrex::FArrayBox>::hasEBFabFactory(in_stack_ffffffffffffe010);
  if (!bVar2) {
    local_4f8 = "state.hasEBFabFactory()";
    local_500 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_504 = 0x46;
    local_510 = 0;
    amrex::Assert_host(in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,line,
                       (char *)in_stack_ffffffffffffe218);
  }
  pFVar6 = amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0xb4b9ad);
  local_568 = (MultiCutFab *)
              __dynamic_cast(pFVar6,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (local_568 != (MultiCutFab *)0x0) {
    amrex::FabArrayBase::boxArray(local_528);
    amrex::FabArrayBase::DistributionMap(local_528);
    local_708 = 0;
    uStack_700 = 0;
    local_718 = 0;
    uStack_710 = 0;
    local_6f8 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0xb4ba56);
    f2 = local_568;
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffe040,in_stack_ffffffffffffe038,
               (DistributionMapping *)in_stack_ffffffffffffe030,
               (int)((ulong)in_stack_ffffffffffffe028 >> 0x20),(int)in_stack_ffffffffffffe028,
               (MFInfo *)in_stack_ffffffffffffe020,
               (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe050);
    amrex::MFInfo::~MFInfo((MFInfo *)0xb4baa5);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe000,(value_type)f2);
    local_730 = amrex::Geometry::Domain((Geometry *)in_stack_00000080);
    amrex::MFItInfo::MFItInfo((MFItInfo *)in_stack_ffffffffffffe010);
    pMVar7 = amrex::MFItInfo::EnableTiling
                       (&local_744,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size);
    amrex::MFItInfo::SetDynamic(pMVar7,true);
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffe030,in_stack_ffffffffffffe028,
               (MFItInfo *)in_stack_ffffffffffffe020);
    while (bVar2 = amrex::MFIter::isValid(&local_7a8), bVar2) {
      amrex::MFIter::tilebox(in_stack_ffffffffffffe060);
      local_7b0 = (Array4<const_double> *)(local_81c + 0x50);
      amrex::MFIter::nodaltilebox
                ((MFIter *)CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
                 (int)((ulong)in_stack_ffffffffffffe068 >> 0x20));
      local_81c._68_8_ = local_81c + 0x28;
      amrex::MFIter::nodaltilebox
                ((MFIter *)CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
                 (int)((ulong)in_stack_ffffffffffffe068 >> 0x20));
      local_81c._28_8_ = (MultiCutFab *)local_81c;
      amrex::MFIter::nodaltilebox
                ((MFIter *)CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
                 (int)((ulong)in_stack_ffffffffffffe068 >> 0x20));
      local_828 = local_844;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                 (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                 (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                 (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                 (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                 (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                 (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
      amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
                ((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
      local_348 = amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                            ((FabArray<amrex::EBCellFlagFab> *)in_stack_ffffffffffffe000,
                             (MFIter *)f2);
      local_288 = (local_348->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_290 = &(local_348->super_BaseFab<amrex::EBCellFlag>).domain;
      local_294 = (local_348->super_BaseFab<amrex::EBCellFlag>).nvar;
      local_19c = 0;
      local_1c8 = (local_290->smallend).vect[0];
      local_1ac = 1;
      iStack_1c4 = (local_348->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      local_2b0.x = (local_290->smallend).vect[0];
      local_2b0.y = (local_290->smallend).vect[1];
      local_1bc = 2;
      local_2b0.z = (local_348->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_f8 = &(local_348->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_fc = 0;
      local_128 = local_f8->vect[0] + 1;
      local_108 = &(local_348->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_10c = 1;
      iStack_124 = (local_348->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      local_118 = &(local_348->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_11c = 2;
      local_2d0.z = (local_348->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_2d0.y = iStack_124;
      local_2d0.x = local_128;
      local_2bc._0_8_ = local_2d0._0_8_;
      local_2bc.z = local_2d0.z;
      local_2a0._0_8_ = local_2b0._0_8_;
      local_2a0.z = local_2b0.z;
      local_1e0._0_8_ = local_2b0._0_8_;
      local_1e0.z = local_2b0.z;
      local_1d0 = local_290;
      local_1c0 = local_2b0.z;
      local_1b8 = local_290;
      local_1a8 = local_290;
      local_198 = local_290;
      local_140._0_8_ = local_2d0._0_8_;
      local_140.z = local_2d0.z;
      local_130 = local_290;
      local_120 = local_2d0.z;
      amrex::Array4<const_amrex::EBCellFlag>::Array4
                ((Array4<const_amrex::EBCellFlag> *)&stack0xfffffffffffff5e8,local_288,&local_2a0,
                 &local_2bc,local_294);
      paVar10 = (anon_class_200_4_0a8c7edc *)&stack0xfffffffffffff5e8;
      FVar5 = amrex::EBCellFlagFab::getType(in_stack_ffffffffffffe128,in_stack_ffffffffffffe120);
      if (FVar5 == covered) {
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                   (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
        iVar3 = (int)((ulong)in_stack_ffffffffffffe000 >> 0x20);
        in_stack_fffffffffffff5e0 = (Geometry *)&stack0xfffffffffffff5a0;
        memcpy(local_aa0,in_stack_fffffffffffff5e0,0x3c);
        memcpy(local_b20,&local_888,0x3c);
        memcpy(auStack_ae0,&local_948,0x3c);
        uVar1 = local_520;
        f2 = (MultiCutFab *)local_81c._28_8_;
        memcpy(local_ba0,&local_8c8,0x3c);
        memcpy(auStack_b60,&local_988,0x3c);
        in_stack_ffffffffffffe008 = (FabArray<amrex::FArrayBox> *)local_ba0;
        in_stack_ffffffffffffe000 = (MultiCutFab *)CONCAT44(iVar3,uVar1);
        amrex::
        ParallelFor<int,int,int,EBMOL::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::PODVector<int,std::allocator<int>>&,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__0,EBMOL::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::PODVector<int,std::allocator<int>>&,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__1,EBMOL::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::PODVector<int,std::allocator<int>>&,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__2,void,void,void>
                  ((Box *)in_stack_ffffffffffffe020,(int)((ulong)in_stack_ffffffffffffe018 >> 0x20),
                   (anon_class_64_1_e8a15f1b *)in_stack_ffffffffffffe010,
                   (Box *)in_stack_ffffffffffffe008,iVar3,(anon_class_128_2_7b0e3944 *)f2,
                   (Box *)in_stack_ffffffffffffe030,(int)in_stack_ffffffffffffe038,
                   (anon_class_128_2_7b0e3d24 *)in_stack_ffffffffffffe040);
        memcpy(local_c20,&local_908,0x3c);
        memcpy(auStack_be0,&local_9c8,0x3c);
        amrex::
        ParallelFor<int,EBMOL::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::PODVector<int,std::allocator<int>>&,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__3,void>
                  ((Box *)in_stack_ffffffffffffe050,(int)((ulong)in_stack_ffffffffffffe048 >> 0x20),
                   (anon_class_128_2_7b0e4104 *)in_stack_ffffffffffffe040);
      }
      else {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffe008,(MFIter *)in_stack_ffffffffffffe000);
        uVar11 = (undefined4)((ulong)in_stack_ffffffffffffe020 >> 0x20);
        uVar9 = (undefined4)((ulong)in_stack_ffffffffffffe028 >> 0x20);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffe008,(MFIter *)in_stack_ffffffffffffe000);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffe008,(MFIter *)in_stack_ffffffffffffe000);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffe008,(MFIter *)in_stack_ffffffffffffe000);
        local_328 = local_7b0;
        local_32c = local_55c;
        local_d40 = (pointer)local_7b0->p;
        local_d38 = local_7b0->jstride;
        local_d30 = local_7b0->kstride;
        local_d28.itype = (uint)local_7b0->nstride;
        amrex::Box::grow((Box *)&local_d40,local_55c);
        FVar5 = amrex::EBCellFlagFab::getType(in_stack_ffffffffffffe128,in_stack_ffffffffffffe120);
        iVar3 = (int)((ulong)in_stack_ffffffffffffe168 >> 0x20);
        local_d21 = FVar5 == regular;
        if ((bool)local_d21) {
          if ((local_539 & 1) == 0) {
            in_stack_ffffffffffffe1b8 = &local_1330;
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                       (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
            paVar10 = in_stack_00000070;
            MOL::ComputeEdgeState
                      (in_stack_ffffffffffffe658,in_stack_ffffffffffffe650,in_stack_ffffffffffffe648
                       ,in_stack_ffffffffffffe640,in_stack_ffffffffffffe638,
                       in_stack_ffffffffffffe634,in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe7a8
                       ,(Array4<const_double> *)in_stack_ffffffffffffe7b0,
                       (Box *)in_stack_ffffffffffffe7b8,
                       (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                       in_stack_ffffffffffffe7c0,(BCRec *)in_stack_ffffffffffffe7c8,
                       (bool)in_stack_ffffffffffffe633);
            uVar11 = (undefined4)((ulong)paVar10 >> 0x20);
          }
          pAVar8 = &local_1370;
          in_stack_ffffffffffffe1b0 = local_7b0;
          amrex::Array4<const_double>::Array4<const_double,_0>(pAVar8,&local_948);
          in_stack_ffffffffffffe008 = (FabArray<amrex::FArrayBox> *)(local_13f0 + 0x40);
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)in_stack_ffffffffffffe008,&local_988);
          in_stack_ffffffffffffe010 = (FabArray<amrex::FArrayBox> *)local_13f0;
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)in_stack_ffffffffffffe010,&local_9c8);
          in_stack_ffffffffffffe028 =
               (FabArrayBase *)(CONCAT44(uVar9,(uint)local_54a) & 0xffffffff00000001);
          in_stack_ffffffffffffe020 = (FabArray<amrex::FArrayBox> *)CONCAT44(uVar11,local_520);
          in_stack_ffffffffffffe018 = in_stack_00000080;
          in_stack_ffffffffffffe198 = in_stack_ffffffffffffe010;
          in_stack_ffffffffffffe1a0 = in_stack_ffffffffffffe008;
          in_stack_ffffffffffffe1a8 = pAVar8;
          HydroUtils::ComputeFluxes
                    (in_stack_ffffffffffffe398,in_stack_ffffffffffffe390,in_stack_ffffffffffffe388,
                     in_stack_ffffffffffffe380,in_stack_ffffffffffffe378,in_stack_ffffffffffffe370,
                     in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe5a8,in_stack_ffffffffffffe5b0,
                     in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5c8,
                     (bool)in_stack_ffffffffffffe36f);
          uVar11 = (undefined4)((ulong)pAVar8 >> 0x20);
          local_13f8 = 0xbff0000000000000;
          pAVar8 = &local_1438;
          fy_00 = local_7b0;
          amrex::Array4<const_double>::Array4<const_double,_0>(pAVar8,&local_888);
          this = &local_1478;
          amrex::Array4<const_double>::Array4<const_double,_0>(this,&local_8c8);
          this_00 = (Array4<const_double> *)&stack0xffffffffffffeb48;
          amrex::Array4<const_double>::Array4<const_double,_0>(this_00,&local_908);
          in_stack_ffffffffffffe000 =
               (MultiCutFab *)(CONCAT44(uVar11,(uint)local_54a) & 0xffffffff00000001);
          f2 = in_stack_00000080;
          HydroUtils::ComputeDivergence
                    ((Box *)this_00,(Array4<double> *)this,pAVar8,fy_00,
                     (Array4<const_double> *)
                     CONCAT44(in_stack_ffffffffffffe174,in_stack_ffffffffffffe170),iVar3,
                     in_stack_ffffffffffffe200,in_stack_ffffffffffffe160,
                     SUB81((ulong)in_stack_ffffffffffffe158 >> 0x38,0));
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                     (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
          in_stack_ffffffffffffeb40 = (Array4<const_double> *)&stack0xffffffffffffeb00;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffe008,(MFIter *)in_stack_ffffffffffffe000);
          local_1508 = local_1548;
          local_1610.m_arena = local_558;
          in_stack_ffffffffffffe168 = local_7b0;
          in_stack_ffffffffffffe174 = local_520;
          memcpy(auStack_1608,local_d20,0x3c);
          memcpy(auStack_15c8,in_stack_ffffffffffffeb40,0x3c);
          memcpy(auStack_1588,local_1508,0x3c);
          amrex::
          ParallelFor<int,EBMOL::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::PODVector<int,std::allocator<int>>&,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__5,void>
                    ((Box *)in_stack_ffffffffffffe050,
                     (int)((ulong)in_stack_ffffffffffffe048 >> 0x20),in_stack_ffffffffffffe040);
        }
        else {
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          uVar11 = (undefined4)((ulong)in_stack_ffffffffffffe048 >> 0x20);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe000,
                     (size_type)f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe000,
                     (size_type)f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe000,
                     (size_type)f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe000,
                     (size_type)f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe000,
                     (size_type)f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe000,
                     (size_type)f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getCentroid((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffe008,(MFIter *)in_stack_ffffffffffffe000);
          if ((local_539 & 1) == 0) {
            in_stack_ffffffffffffe218 = &local_1010;
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                       (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
            uVar11 = (undefined4)((ulong)(local_1010.super_CoordSys.inv_dx + 1) >> 0x20);
            in_stack_ffffffffffffe050 = paVar10;
            ComputeEdgeState(in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                             in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0,
                             in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc4,
                             (Array4<const_double> *)in_stack_fffffffffffff130,
                             (Array4<const_double> *)in_stack_fffffffffffff138,
                             (Array4<const_double> *)in_stack_fffffffffffff140,
                             (Box *)in_stack_fffffffffffff148,
                             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                             in_stack_fffffffffffff150,(BCRec *)in_stack_fffffffffffff158,
                             (Array4<const_double> *)in_stack_fffffffffffff160,
                             (Array4<const_double> *)in_stack_fffffffffffff168,
                             (Array4<const_double> *)in_stack_fffffffffffff170,
                             (Array4<const_double> *)in_stack_fffffffffffff178._M_pi,
                             in_stack_fffffffffffff180,
                             (Array4<const_amrex::EBCellFlag> *)in_stack_fffffffffffff188,
                             (bool)in_stack_ffffffffffffefc3);
          }
          in_stack_ffffffffffffe200 = (Geometry *)&stack0xffffffffffffefb0;
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)in_stack_ffffffffffffe200,&local_948);
          pAVar8 = &local_1090;
          amrex::Array4<const_double>::Array4<const_double,_0>(pAVar8,&local_988);
          in_stack_ffffffffffffe010 = (FabArray<amrex::FArrayBox> *)&stack0xffffffffffffef30;
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)in_stack_ffffffffffffe010,&local_9c8);
          in_stack_ffffffffffffe048 =
               (MultiCutFab *)(CONCAT44(uVar11,(uint)local_54a) & 0xffffffff00000001);
          in_stack_ffffffffffffe038 = (BoxArray *)(ulong)local_520;
          in_stack_ffffffffffffe028 = (FabArrayBase *)&stack0xfffffffffffff0c8;
          in_stack_ffffffffffffe020 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffff120;
          in_stack_ffffffffffffe018 = (MultiCutFab *)&stack0xfffffffffffff178;
          uVar11 = (undefined4)((ulong)local_ce0 >> 0x20);
          in_stack_ffffffffffffe030 = in_stack_00000080;
          iVar3 = (int)&stack0xffffffffffffdff8;
          HydroUtils::EB_ComputeFluxes
                    (in_stack_ffffffffffffe518,in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
                     in_stack_ffffffffffffe500,in_stack_ffffffffffffe4f8,in_stack_ffffffffffffe4f0,
                     in_stack_ffffffffffffe720,in_stack_ffffffffffffe728,in_stack_ffffffffffffe730,
                     in_stack_ffffffffffffe738,in_stack_ffffffffffffe740,in_stack_ffffffffffffe748,
                     in_stack_ffffffffffffe750,in_stack_ffffffffffffe758,in_stack_ffffffffffffe760,
                     in_stack_ffffffffffffe768,(bool)in_stack_ffffffffffffe4ef);
          uVar9 = (undefined4)((ulong)pAVar8 >> 0x20);
          local_10d8 = 0xbff0000000000000;
          pAVar8 = local_7b0;
          amrex::Array4<const_double>::Array4<const_double,_0>(&local_1118,&local_888);
          amrex::Array4<const_double>::Array4<const_double,_0>(&local_1158,&local_8c8);
          amrex::Array4<const_double>::Array4<const_double,_0>(&local_1198,&local_908);
          in_stack_ffffffffffffe008 =
               (FabArray<amrex::FArrayBox> *)(CONCAT44(uVar9,(uint)local_54a) & 0xffffffff00000001);
          f2 = (MultiCutFab *)CONCAT44(uVar11,local_520);
          in_stack_ffffffffffffe000 = in_stack_00000080;
          HydroUtils::EB_ComputeDivergence
                    ((Box *)pAVar8,
                     (Array4<double> *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8)
                     ,in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b0,
                     in_stack_ffffffffffffe1a8,iVar3,in_stack_ffffffffffffe218,
                     (Real)in_stack_ffffffffffffe1a0,
                     SUB81((ulong)in_stack_ffffffffffffe198 >> 0x38,0));
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                     (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
          local_11a0 = local_11e0;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffe008,(MFIter *)in_stack_ffffffffffffe000);
          local_11e8 = local_1228;
          local_12f0 = local_558;
          in_stack_ffffffffffffe1c0 = local_7b0;
          in_stack_ffffffffffffe1cc = local_520;
          memcpy(auStack_12e8,local_d20,0x3c);
          memcpy(auStack_12a8,local_11a0,0x3c);
          memcpy(auStack_1268,local_11e8,0x3c);
          amrex::
          ParallelFor<int,EBMOL::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::PODVector<int,std::allocator<int>>&,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__4,void>
                    ((Box *)in_stack_ffffffffffffe050,
                     (int)((ulong)in_stack_ffffffffffffe048 >> 0x20),paVar10);
          in_stack_ffffffffffffe040 = paVar10;
        }
      }
      amrex::MFIter::operator++(&local_7a8);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffe000);
    local_1630.vect = (int  [3])amrex::Geometry::periodicity((Geometry *)in_stack_ffffffffffffe030);
    local_1618 = local_1630.vect[2];
    local_1620 = (Ref *)local_1630.vect._0_8_;
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_ffffffffffffe020,(Periodicity *)in_stack_ffffffffffffe018,
               SUB81((ulong)in_stack_ffffffffffffe010 >> 0x38,0));
    pMVar7 = amrex::MFItInfo::EnableTiling
                       (&local_744,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size);
    amrex::MFItInfo::SetDynamic(pMVar7,true);
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffe030,in_stack_ffffffffffffe028,
               (MFItInfo *)in_stack_ffffffffffffe020);
    while (bVar2 = amrex::MFIter::isValid((MFIter *)(local_1708 + 0x78)), bVar2) {
      amrex::MFIter::tilebox(in_stack_ffffffffffffe060);
      local_1708._112_8_ = (long)local_1708 + 0x54;
      amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
                ((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
      local_1708._72_8_ =
           amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                     ((FabArray<amrex::EBCellFlagFab> *)in_stack_ffffffffffffe000,(MFIter *)f2);
      local_238 = (((EBCellFlagFab *)local_1708._72_8_)->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_240 = &(((EBCellFlagFab *)local_1708._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain;
      local_244 = (((EBCellFlagFab *)local_1708._72_8_)->super_BaseFab<amrex::EBCellFlag>).nvar;
      local_1ec = 0;
      local_218 = (local_240->smallend).vect[0];
      local_1fc = 1;
      iStack_214 = (((EBCellFlagFab *)local_1708._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                   smallend.vect[1];
      local_260.x = (local_240->smallend).vect[0];
      local_260.y = (local_240->smallend).vect[1];
      local_20c = 2;
      local_260.z = (((EBCellFlagFab *)local_1708._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                    smallend.vect[2];
      local_148 = &(((EBCellFlagFab *)local_1708._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                   bigend;
      local_14c = 0;
      local_178 = local_148->vect[0] + 1;
      local_158 = &(((EBCellFlagFab *)local_1708._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                   bigend;
      local_15c = 1;
      iStack_174 = (((EBCellFlagFab *)local_1708._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                   bigend.vect[1] + 1;
      local_168 = &(((EBCellFlagFab *)local_1708._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                   bigend;
      local_16c = 2;
      local_280.z = (((EBCellFlagFab *)local_1708._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                    bigend.vect[2] + 1;
      local_280.y = iStack_174;
      local_280.x = local_178;
      local_350 = (EBCellFlagFab *)local_1708._72_8_;
      local_26c._0_8_ = local_280._0_8_;
      local_26c.z = local_280.z;
      local_250._0_8_ = local_260._0_8_;
      local_250.z = local_260.z;
      local_230._0_8_ = local_260._0_8_;
      local_230.z = local_260.z;
      local_220 = local_240;
      local_210 = local_260.z;
      local_208 = local_240;
      local_1f8 = local_240;
      local_1e8 = local_240;
      local_190._0_8_ = local_280._0_8_;
      local_190.z = local_280.z;
      local_180 = local_240;
      local_170 = local_280.z;
      amrex::Array4<const_amrex::EBCellFlag>::Array4
                ((Array4<const_amrex::EBCellFlag> *)local_1708,local_238,&local_250,&local_26c,
                 local_244);
      local_1708._64_8_ = local_1708;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                 (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
      local_1710.m_arena = local_1750;
      FVar5 = amrex::EBCellFlagFab::getType(in_stack_ffffffffffffe128,in_stack_ffffffffffffe120);
      if (FVar5 != covered) {
        local_338._M_head_impl = (PCData<amrex::FArrayBox> *)local_1708._112_8_;
        local_33c = 4;
        local_176c._0_8_ = *(undefined8 *)local_1708._112_8_;
        local_176c._8_8_ = *(FabArray<amrex::FArrayBox> **)(local_1708._112_8_ + 8);
        local_175c = *(pointer *)(local_1708._112_8_ + 0x10);
        local_1754.itype =
             *(uint *)&(((Vector<int,_std::allocator<int>_> *)(local_1708._112_8_ + 0x18))->
                       super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
        amrex::Box::grow((Box *)local_176c,4);
        FVar5 = amrex::EBCellFlagFab::getType(in_stack_ffffffffffffe128,in_stack_ffffffffffffe120);
        if (FVar5 == regular) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffe008,(MFIter *)in_stack_ffffffffffffe000);
          memcpy(local_1d10,local_1710.m_arena,0x3c);
          memcpy(auStack_1cd0,&stack0xffffffffffffe370,0x3c);
          amrex::
          ParallelFor<int,EBMOL::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::PODVector<int,std::allocator<int>>&,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__8,void>
                    ((Box *)in_stack_ffffffffffffe050,
                     (int)((ulong)in_stack_ffffffffffffe048 >> 0x20),
                     (anon_class_128_2_3c46345a *)in_stack_ffffffffffffe040);
        }
        else {
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe000,
                     (size_type)f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          in_stack_ffffffffffffe120 = (Box *)0x1;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe000,
                     (size_type)f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe000,
                     (size_type)f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe000,
                     (size_type)f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe000,
                     (size_type)f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          in_stack_ffffffffffffe128 = &local_1980;
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffe000,
                     (size_type)f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getCentroid((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffe000,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffe000);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffe008,(MFIter *)in_stack_ffffffffffffe000);
          local_1a28[0].smallend.vect._0_8_ = *(undefined8 *)local_1708._112_8_;
          local_1a28[0]._20_8_ = *(undefined8 *)(local_1708._112_8_ + 0x14);
          local_1a28[0].bigend.vect[1] =
               (int)((ulong)*(undefined8 *)(local_1708._112_8_ + 0xc) >> 0x20);
          local_1a28[0].smallend.vect[2] =
               (int)*(FabArray<amrex::FArrayBox> **)(local_1708._112_8_ + 8);
          local_1a28[0].bigend.vect[0] =
               (int)((ulong)*(FabArray<amrex::FArrayBox> **)(local_1708._112_8_ + 8) >> 0x20);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe000,(char *)f2);
          if (bVar2) {
            amrex::Box::grow(local_1a28,3);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffe000,(char *)f2);
            if (bVar2) {
              amrex::Box::grow(local_1a28,2);
            }
          }
          amrex::FArrayBox::FArrayBox
                    ((FArrayBox *)in_stack_ffffffffffffe010,(Box *)in_stack_ffffffffffffe008,
                     (int)((ulong)in_stack_ffffffffffffe000 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffe000 >> 0x18,0),
                     SUB81((ulong)in_stack_ffffffffffffe000 >> 0x10,0),(Arena *)f2);
          amrex::BaseFab<double>::elixir<double,_0>((BaseFab<double> *)in_stack_ffffffffffffe028);
          local_2dc = 0;
          local_b0 = &stack0xffffffffffffe5a8;
          local_b4 = (int)((ulong)in_stack_ffffffffffffe5c0 >> 0x20);
          local_5c = 0;
          local_88 = SUB84(in_stack_ffffffffffffe5a8,0);
          local_6c = 1;
          uStack_84 = (undefined4)((ulong)in_stack_ffffffffffffe5a8 >> 0x20);
          local_7c = 2;
          local_c8 = (int)in_stack_ffffffffffffe5b0;
          local_8 = &stack0xffffffffffffe5b4;
          local_c = 0;
          local_38 = (int)((ulong)in_stack_ffffffffffffe5b0 >> 0x20) + 1;
          local_18 = &stack0xffffffffffffe5b4;
          local_1c = 1;
          iStack_34 = (int)in_stack_ffffffffffffe5b8 + 1;
          local_28 = &stack0xffffffffffffe5b4;
          local_2c = 2;
          local_f0.z = (int)((ulong)in_stack_ffffffffffffe5b8 >> 0x20) + 1;
          local_f0.y = iStack_34;
          local_f0.x = local_38;
          local_2d8 = local_1a70;
          local_e0[0]._0_8_ = local_f0._0_8_;
          local_e0[0].z = local_f0.z;
          local_c0.z = local_c8;
          local_98 = local_c8;
          local_90 = local_b0;
          local_80 = local_c8;
          local_78 = local_b0;
          local_68 = local_b0;
          local_58 = local_b0;
          local_50._0_8_ = local_f0._0_8_;
          local_50.z = local_f0.z;
          local_40 = local_b0;
          local_30 = local_f0.z;
          amrex::Array4<double>::Array4
                    (&local_320,(double *)in_stack_ffffffffffffe5a0,&local_c0,local_e0,local_b4);
          amrex::Array4<double>::Array4<double,_0>(&local_1ac8,&local_320,local_2dc);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe000,(char *)f2);
          if (bVar2) {
            amrex::Box::Box<double>((Box *)in_stack_ffffffffffffe000,(Array4<double> *)f2);
            memcpy(local_1b28,&local_1ac8,0x3c);
            amrex::
            ParallelFor<EBMOL::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::PODVector<int,std::allocator<int>>&,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__6>
                      ((Box *)in_stack_ffffffffffffe050,
                       (anon_class_64_1_f62ae5da *)in_stack_ffffffffffffe048);
          }
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffe008,(MFIter *)in_stack_ffffffffffffe000);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffe010,(MFIter *)in_stack_ffffffffffffe008,
                     (int)((ulong)in_stack_ffffffffffffe000 >> 0x20));
          f2 = (MultiCutFab *)local_1708._64_8_;
          std::__cxx11::string::string((string *)(local_1c08 + 0x40),in_stack_00000090);
          in_stack_ffffffffffffe060 = (MFIter *)local_1c08;
          amrex::Array4<const_double>::Array4((Array4<const_double> *)in_stack_ffffffffffffe060);
          in_stack_ffffffffffffe050 = (anon_class_200_4_0a8c7edc *)(local_1c08 + 0x40);
          in_stack_ffffffffffffe028 =
               (FabArrayBase *)
               &local_1980.m_typemap._M_t._M_impl.super__Rb_tree_header._M_node_count;
          in_stack_ffffffffffffe010 = (FabArray<amrex::FArrayBox> *)&stack0xffffffffffffe7a0;
          in_stack_ffffffffffffe008 = (FabArray<amrex::FArrayBox> *)local_1808;
          in_stack_ffffffffffffe000 = (MultiCutFab *)(local_1808 + 0x58);
          in_stack_ffffffffffffe040 = in_stack_00000070;
          in_stack_ffffffffffffe048 = in_stack_00000080;
          Redistribution::Apply
                    (in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb5c,in_stack_ffffffffffffeb50,
                     in_stack_ffffffffffffeb48,in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38,
                     (Array4<const_amrex::EBCellFlag> *)in_stack_fffffffffffff590.hp,
                     in_stack_fffffffffffff598,in_stack_fffffffffffff5a0,in_stack_fffffffffffff5a8,
                     in_stack_fffffffffffff5b0,in_stack_fffffffffffff5b8,in_stack_fffffffffffff5c0,
                     (Array4<const_double> *)in_stack_fffffffffffff5c8._M_head_impl,
                     (Array4<const_double> *)in_stack_fffffffffffff5d0._M_head_impl,
                     (BCRec *)in_stack_fffffffffffff5d8._M_head_impl,in_stack_fffffffffffff5e0,
                     in_stack_ffffffffffffeb30,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5f0,
                     in_stack_ffffffffffffeb28,in_stack_fffffffffffff5f8);
          std::__cxx11::string::~string((string *)(local_1c08 + 0x40));
          memcpy(local_1c48,local_1710.m_arena,0x3c);
          amrex::
          ParallelFor<int,EBMOL::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::PODVector<int,std::allocator<int>>&,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__7,void>
                    ((Box *)in_stack_ffffffffffffe050,
                     (int)((ulong)in_stack_ffffffffffffe048 >> 0x20),
                     (anon_class_64_1_e8a15f1b *)in_stack_ffffffffffffe040);
          amrex::Gpu::Elixir::~Elixir((Elixir *)in_stack_ffffffffffffe000);
          amrex::FArrayBox::~FArrayBox((FArrayBox *)0xb4da3b);
        }
      }
      amrex::MFIter::operator++((MFIter *)(local_1708 + 0x78));
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffe000);
    amrex::MultiFab::~MultiFab((MultiFab *)0xb4db45);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
EBMOL::ComputeAofs ( MultiFab& aofs, int aofs_comp, int ncomp,
                     MultiFab const& state, int state_comp,
                     AMREX_D_DECL( MultiFab const& umac,
                                   MultiFab const& vmac,
                                   MultiFab const& wmac),
                     AMREX_D_DECL( MultiFab& xedge,
                                   MultiFab& yedge,
                                   MultiFab& zedge),
                     int  edge_comp,
                     bool known_edgestate,
                     AMREX_D_DECL( MultiFab& xfluxes,
                                   MultiFab& yfluxes,
                                   MultiFab& zfluxes),
                     int fluxes_comp,
                     MultiFab const& divu,
                     Vector<BCRec> const& bcs,
                     BCRec  const* d_bcrec_ptr,
                     Gpu::DeviceVector<int>& iconserv,
                     Geometry const&  geom,
                     const Real dt,
                     const bool is_velocity,
                     std::string redistribution_type )
{
    BL_PROFILE("EBMOL::ComputeAofs()");

    bool fluxes_are_area_weighted = true;

    int const* iconserv_ptr = iconserv.data();

    AMREX_ALWAYS_ASSERT(aofs.nComp()  >= aofs_comp  + ncomp);
    AMREX_ALWAYS_ASSERT(state.nComp() >= state_comp + ncomp);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zedge.nComp() >= edge_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zfluxes.nComp() >= fluxes_comp  + ncomp););
    AMREX_ALWAYS_ASSERT(aofs.nGrow() == 0);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nGrow() == xedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(yfluxes.nGrow() == yedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(zfluxes.nGrow() == zedge.nGrow()););

    // To compute edge states, need at least 2 ghost cells in state
    if ( !known_edgestate )
        AMREX_ALWAYS_ASSERT(state.nGrow() >= 2);

    // If !known_edgestate, need 2 additional cells in state to compute
    //  the slopes needed to compute the edge state, since MOL uses slope
    //  order==2.
    int halo = known_edgestate ? 0 : 2;

    AMREX_ALWAYS_ASSERT(state.hasEBFabFactory());
    auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());

    // Create temporary holder for advection term. Needed so we can call FillBoundary.
    MultiFab advc(state.boxArray(),state.DistributionMap(),ncomp,3,MFInfo(),ebfactory);
    advc.setVal(0.);

    Box  const& domain = geom.Domain();
    MFItInfo mfi_info;

    if (Gpu::notInLaunchRegion())  mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

    AMREX_D_TERM( const Box& xbx = mfi.nodaltilebox(0);,
                      const Box& ybx = mfi.nodaltilebox(1);,
                      const Box& zbx = mfi.nodaltilebox(2); );

        AMREX_D_TERM( Array4<Real> fx = xfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fy = yfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fz = zfluxes.array(mfi,fluxes_comp););

    AMREX_D_TERM( Array4<Real> xed = xedge.array(mfi,edge_comp);,
                      Array4<Real> yed = yedge.array(mfi,edge_comp);,
                      Array4<Real> zed = zedge.array(mfi,edge_comp););

        // Initialize covered cells
        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();

        if (flagfab.getType(bx) == FabType::covered)
        {
            auto const& aofs_arr = aofs.array(mfi, aofs_comp);

            amrex::ParallelFor(
                bx, ncomp, [aofs_arr] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { aofs_arr( i, j, k, n ) = covered_val;},

                xbx, ncomp, [fx,xed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fx( i, j, k, n ) = 0.0; xed( i, j, k, n ) = covered_val;},

                ybx, ncomp, [fy,yed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fy( i, j, k, n ) = 0.0; yed( i, j, k, n ) = covered_val;});

#if (AMREX_SPACEDIM==3)
            amrex::ParallelFor(
                zbx, ncomp, [fz,zed]AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fz( i, j, k, n ) = 0.0; zed( i, j, k, n ) = covered_val;});
#endif
        }
        else
        {

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                          Array4<Real const> v = vmac.const_array(mfi);,
                          Array4<Real const> w = wmac.const_array(mfi););

        Array4<Real> advc_arr = advc.array(mfi);

            bool regular = flagfab.getType(amrex::grow(bx,halo)) == FabType::regular;

            if (!regular)
            {
                AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
                              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
                              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

                AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
                              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
                              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

                Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);
                auto vfrac = ebfactory.getVolFrac().const_array(mfi);

                // Compute edge state if needed
                if (!known_edgestate)
                {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

                    EBMOL::ComputeEdgeState( bx, AMREX_D_DECL(xed,yed,zed),
                                             q, ncomp,
                                             AMREX_D_DECL(u,v,w),
                                             domain, bcs, d_bcrec_ptr,
                                             AMREX_D_DECL(fcx,fcy,fcz),
                                             ccc, vfrac, flag, is_velocity );
                }

                // Compute fluxes
                HydroUtils::EB_ComputeFluxes(bx, AMREX_D_DECL(fx,fy,fz),
                                             AMREX_D_DECL(u,v,w),
                                             AMREX_D_DECL(xed,yed,zed),
                                             AMREX_D_DECL(apx,apy,apz),
                                             geom, ncomp, flag, fluxes_are_area_weighted );

                //
                // Compute divergence
                //

        // Compute -div because that's what redistribution needs
                Real mult = -1.0;
                HydroUtils::EB_ComputeDivergence(bx, advc_arr,
                                                 AMREX_D_DECL(fx,fy,fz),
                                                 vfrac, ncomp, geom,
                                                 mult, fluxes_are_area_weighted );
                // Account for extra term needed for convective differencing
        // Don't forget we're mutliplying by -1.0 here...
                auto const& q = state.array(mfi, state_comp);
                auto const& divu_arr  = divu.array(mfi);
        amrex::ParallelFor(bx, ncomp, [=]
                AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                {
                    if (!iconserv_ptr[n])
                        advc_arr( i, j, k, n ) += q(i,j,k,n)*divu_arr(i,j,k);

                });
            }
            else
            {
                // Compute edge state if needed
                if (!known_edgestate)
                {
                    Array4<Real const> const q = state.const_array(mfi,state_comp);
                    MOL::ComputeEdgeState( bx,
                                           AMREX_D_DECL( xed, yed, zed ),
                                           q, ncomp,
                                           AMREX_D_DECL( u, v, w ),
                                           domain, bcs, d_bcrec_ptr,
                                           is_velocity);
                }

                // Compute fluxes
                HydroUtils::ComputeFluxes( bx,
                                           AMREX_D_DECL(fx,fy,fz),
                                           AMREX_D_DECL(u,v,w),
                                           AMREX_D_DECL(xed,yed,zed),
                                           geom, ncomp, fluxes_are_area_weighted  );

                // Compute divergence
                // We use minus sign, i.e. -div, for consistency with EB above
                Real mult = -1.0;
                HydroUtils::ComputeDivergence(bx, advc_arr,
                                              AMREX_D_DECL(fx,fy,fz),
                                              ncomp, geom,
                                              mult, fluxes_are_area_weighted );

                // Account for extra term needed for convective differencing
                auto const& q = state.array(mfi, state_comp);
                auto const& divu_arr  = divu.array(mfi);
                amrex::ParallelFor(bx, ncomp, [=]
                AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                {
                    if (!iconserv_ptr[n])
              advc_arr( i, j, k, n ) += q(i,j,k,n)*divu_arr(i,j,k);
                });
        }
        }
    }

    advc.FillBoundary(geom.periodicity());

    if (Gpu::notInLaunchRegion())  mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();
    auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        if (flagfab.getType(bx) != FabType::covered )
    {
      // FIXME? not sure if 4 is really needed or if 3 could do
      // But this is a safe choice
      if (flagfab.getType(grow(bx,4)) != FabType::regular)
      {
        //
        // Redistribute
        //
        AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

        AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

        Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);
        auto vfrac = ebfactory.getVolFrac().const_array(mfi);

        // This is scratch space if calling StateRedistribute,
            //  but is used as the weights (here set to 1) if calling
            //  FluxRedistribute
        Box gbx = bx;

        if (redistribution_type == "StateRedist")
          gbx.grow(3);
        else if (redistribution_type == "FluxRedist")
          gbx.grow(2);

        FArrayBox tmpfab(gbx, ncomp);
        Elixir eli = tmpfab.elixir();
        Array4<Real> scratch = tmpfab.array(0);
        if (redistribution_type == "FluxRedist")
        {
          amrex::ParallelFor(Box(scratch),
              [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
              { scratch(i,j,k) = 1.;});
            }

        Redistribution::Apply( bx, ncomp, aofs_arr, advc.array(mfi),
                   state.const_array(mfi, state_comp), scratch, flag,
                   AMREX_D_DECL(apx,apy,apz), vfrac,
                   AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bcrec_ptr,
                   geom, dt, redistribution_type );

        // Change sign because we computed -div for all cases
        amrex::ParallelFor(bx, ncomp, [aofs_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) *=  - 1.0; });
      }
      else
      {
        // Change sign because we computed -div for all cases
        auto const& advc_arr = advc.array(mfi);
        amrex::ParallelFor(bx, ncomp, [aofs_arr, advc_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) =  - advc_arr(i,j,k,n); });
      }
    }
    }
}